

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

bool QApplication::isEffectEnabled(UIEffect effect)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  undefined1 local_40 [12];
  undefined8 uStack_34;
  undefined4 local_2c;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (QCoreApplication::self == 0) {
    local_40._0_4_ = 2;
    local_2c = 0;
    local_40._4_8_ = 0;
    uStack_34 = 0;
    local_28 = "default";
    bVar4 = false;
    QMessageLogger::warning(local_40,"Must construct a QApplication first.");
  }
  else {
    QColormap::instance((int)(QColormap *)local_40);
    iVar2 = QColormap::depth((QColormap *)local_40);
    iVar1 = QApplicationPrivate::enabledAnimations;
    if ((iVar2 < 0x10) || ((QApplicationPrivate::enabledAnimations & 1U) == 0)) {
      bVar4 = false;
    }
    else {
      uVar3 = uiEffectToFlag(effect);
      bVar4 = (uVar3 & iVar1) != 0;
    }
    QColormap::~QColormap((QColormap *)local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QApplication::isEffectEnabled(Qt::UIEffect effect)
{
    CHECK_QAPP_INSTANCE(false)
    return QColormap::instance().depth() >= 16
           && (QApplicationPrivate::enabledAnimations & QPlatformTheme::GeneralUiEffect)
           && (QApplicationPrivate::enabledAnimations & uiEffectToFlag(effect));
}